

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IsShadowTableOf(sqlite3 *db,Table *pTab,char *zName)

{
  int N;
  int iVar1;
  long *plVar2;
  char *in_RDX;
  undefined8 *in_RSI;
  Module *pMod;
  int nName;
  char *in_stack_ffffffffffffffc8;
  Hash *pH;
  int local_4;
  
  pH = (Hash *)&DAT_aaaaaaaaaaaaaaaa;
  if (*(char *)((long)in_RSI + 0x3f) == '\x01') {
    N = sqlite3Strlen30(in_stack_ffffffffffffffc8);
    iVar1 = sqlite3_strnicmp(in_RDX,(char *)*in_RSI,N);
    if (iVar1 == 0) {
      if (in_RDX[N] == '_') {
        plVar2 = (long *)sqlite3HashFind(pH,in_stack_ffffffffffffffc8);
        if (plVar2 == (long *)0x0) {
          local_4 = 0;
        }
        else if (*(int *)*plVar2 < 3) {
          local_4 = 0;
        }
        else if (*(long *)(*plVar2 + 0xb8) == 0) {
          local_4 = 0;
        }
        else {
          local_4 = (**(code **)(*plVar2 + 0xb8))(in_RDX + (long)N + 1);
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsShadowTableOf(sqlite3 *db, Table *pTab, const char *zName){
  int nName;                    /* Length of zName */
  Module *pMod;                 /* Module for the virtual table */

  if( !IsVirtual(pTab) ) return 0;
  nName = sqlite3Strlen30(pTab->zName);
  if( sqlite3_strnicmp(zName, pTab->zName, nName)!=0 ) return 0;
  if( zName[nName]!='_' ) return 0;
  pMod = (Module*)sqlite3HashFind(&db->aModule, pTab->u.vtab.azArg[0]);
  if( pMod==0 ) return 0;
  if( pMod->pModule->iVersion<3 ) return 0;
  if( pMod->pModule->xShadowName==0 ) return 0;
  return pMod->pModule->xShadowName(zName+nName+1);
}